

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::docCharacters
          (AbstractDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMParentNode *pDVar3;
  DOMNode *pDVar2;
  
  if (this->fWithinElement == true) {
    if (cdataSection) {
      iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x22])(this,chars,length);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
    }
    else {
      iVar1 = (*this->fCurrentNode->_vptr_DOMNode[4])();
      if (iVar1 == 3) {
        DOMTextImpl::appendDataFast((DOMTextImpl *)this->fCurrentNode,chars,length);
        return;
      }
      iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x23])(this,chars,length);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
    }
    pDVar3 = castToParentImpl(this->fCurrentParent);
    (**pDVar3->_vptr_DOMParentNode)(pDVar3,pDVar2);
    this->fCurrentNode = pDVar2;
  }
  return;
}

Assistant:

void AbstractDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t    length
                              , const bool         cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (cdataSection == true)
    {
        DOMCDATASection *node = createCDATASection (chars, length);
        castToParentImpl (fCurrentParent)->appendChildFast (node);
        fCurrentNode = node;
    }
    else
    {
        if (fCurrentNode->getNodeType() == DOMNode::TEXT_NODE)
        {
            DOMTextImpl *node = (DOMTextImpl*)fCurrentNode;
            node->appendDataFast(chars, length);
        }
        else
        {
            DOMText *node = createText (chars, length);
            castToParentImpl (fCurrentParent)->appendChildFast (node);
            fCurrentNode = node;
        }
    }
}